

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<ValueExtractor<long_long>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (ValueExtractor<long_long> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *arg)

{
  void *pvVar1;
  basic_string_view<char> bVar2;
  handle hVar3;
  undefined8 uVar4;
  longlong lVar5;
  custom_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *in_RSI;
  ValueExtractor<long_long> *in_RDI;
  char *in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  ValueExtractor<long_long> *in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa8;
  undefined2 uVar6;
  undefined2 in_stack_ffffffffffffffaa;
  undefined2 uVar7;
  uint in_stack_ffffffffffffffac;
  bool bVar9;
  undefined4 uVar8;
  ValueExtractor<long_long> *in_stack_ffffffffffffffb0;
  _func_void_void_ptr_basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_ptr
  *p_Var10;
  handle local_48;
  basic_string_view<char> local_38 [3];
  
  bVar9 = SUB41(in_stack_ffffffffffffffac >> 0x18,0);
  switch(*(undefined4 *)&in_RSI[1].value) {
  case 0:
    break;
  case 1:
    uVar4 = __cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure
              ((assertion_failure *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    __cxa_throw(uVar4,&assertion_failure::typeinfo,assertion_failure::~assertion_failure);
  case 2:
    ValueExtractor<long_long>::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  case 3:
    ValueExtractor<long_long>::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  case 4:
    lVar5 = ValueExtractor<long_long>::operator()(in_RDI,(longlong)in_RSI->value);
    return lVar5;
  case 5:
    ValueExtractor<long_long>::operator()
              (in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,
                        CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)));
  case 6:
    ValueExtractor<long_long>::operator()(in_stack_ffffffffffffffb0,bVar9);
  case 7:
    ValueExtractor<long_long>::operator()(in_stack_ffffffffffffffb0,bVar9);
  case 8:
    ValueExtractor<long_long>::operator()
              (in_stack_ffffffffffffffb0,
               (double)CONCAT44(in_stack_ffffffffffffffac,
                                CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)));
  case 9:
    ValueExtractor<long_long>::operator()
              (in_stack_ffffffffffffffb0,
               (longdouble)CONCAT28(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0));
  case 10:
    ValueExtractor<long_long>::operator()
              (in_stack_ffffffffffffffb0,
               (char *)CONCAT44(in_stack_ffffffffffffffac,
                                CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)));
  case 0xb:
    basic_string_view<char>::basic_string_view
              (local_38,(char *)in_RSI->value,(size_t)in_RSI->format);
    bVar2.data_._2_2_ = in_stack_ffffffffffffffaa;
    bVar2.data_._0_2_ = in_stack_ffffffffffffffa8;
    bVar2.data_._4_4_ = in_stack_ffffffffffffffac;
    bVar2.size_ = (size_t)in_stack_ffffffffffffffb0;
    ValueExtractor<long_long>::operator()(in_stack_ffffffffffffffa0,bVar2);
  case 0xc:
    ValueExtractor<long_long>::operator()
              (in_stack_ffffffffffffffb0,
               (void *)CONCAT44(in_stack_ffffffffffffffac,
                                CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)));
  case 0xd:
    pvVar1 = in_RSI->value;
    uVar6 = SUB82(pvVar1,0);
    uVar7 = (undefined2)((ulong)pvVar1 >> 0x10);
    uVar8 = (undefined4)((ulong)pvVar1 >> 0x20);
    p_Var10 = in_RSI->format;
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::handle::handle(&local_48,*in_RSI);
    hVar3.custom_.value._2_2_ = uVar7;
    hVar3.custom_.value._0_2_ = uVar6;
    hVar3.custom_.value._4_4_ = uVar8;
    hVar3.custom_.format = p_Var10;
    ValueExtractor<long_long>::operator()(in_stack_ffffffffffffffa0,hVar3);
  }
  ValueExtractor<long_long>::operator()(in_RDI);
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}